

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_graph.c
# Opt level: O0

ecs_edge_t * get_edge(ecs_table_t *node,ecs_entity_t e)

{
  ecs_edge_t *peVar1;
  ecs_map_t *peVar2;
  ecs_entity_t e_local;
  ecs_table_t *node_local;
  
  if (e < 0x100) {
    if (node->lo_edges == (ecs_edge_t *)0x0) {
      peVar1 = (ecs_edge_t *)(*ecs_os_api.calloc_)(0x1000);
      node->lo_edges = peVar1;
    }
    node_local = (ecs_table_t *)(node->lo_edges + e);
  }
  else {
    if (node->hi_edges == (ecs_map_t *)0x0) {
      peVar2 = _ecs_map_new(0x10,8,1);
      node->hi_edges = peVar2;
    }
    node_local = (ecs_table_t *)_ecs_map_ensure(node->hi_edges,0x10,e);
  }
  return (ecs_edge_t *)node_local;
}

Assistant:

static
ecs_edge_t* get_edge(
    ecs_table_t *node,
    ecs_entity_t e)
{
    if (e < ECS_HI_COMPONENT_ID) {
        if (!node->lo_edges) {
            node->lo_edges = ecs_os_calloc(sizeof(ecs_edge_t) * ECS_HI_COMPONENT_ID);
        }
        return &node->lo_edges[e];
    } else {
        if (!node->hi_edges) {
            node->hi_edges = ecs_map_new(ecs_edge_t, 1);
        }
        return ecs_map_ensure(node->hi_edges, ecs_edge_t, e);
    }
}